

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_matrix.cpp
# Opt level: O0

Reals __thiscall Omega_h::matrices_times_vectors(Omega_h *this,Reals *ms,Reals *vs,Int dim)

{
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *pvVar1;
  Reals RVar2;
  Read<double> local_98;
  Read<double> local_88;
  Read<double> local_78;
  Read<double> local_68 [2];
  Read<double> local_48;
  Read<double> local_38;
  Int local_24;
  Reals *pRStack_20;
  Int dim_local;
  Reals *vs_local;
  Reals *ms_local;
  
  local_24 = dim;
  pRStack_20 = vs;
  vs_local = ms;
  ms_local = (Reals *)this;
  if (dim == 3) {
    Read<double>::Read(&local_38,ms);
    Read<double>::Read(&local_48,vs);
    matrices_times_vectors_dim<3>(this,&local_38,&local_48);
    Read<double>::~Read(&local_48);
    Read<double>::~Read(&local_38);
    pvVar1 = extraout_RDX;
  }
  else if (dim == 2) {
    Read<double>::Read(local_68,ms);
    Read<double>::Read(&local_78,vs);
    matrices_times_vectors_dim<2>(this,local_68,&local_78);
    Read<double>::~Read(&local_78);
    Read<double>::~Read(local_68);
    pvVar1 = extraout_RDX_00;
  }
  else {
    if (dim != 1) {
      fail("assertion %s failed at %s +%d\n","false",
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_matrix.cpp"
           ,0x42);
    }
    Read<double>::Read(&local_88,ms);
    Read<double>::Read(&local_98,vs);
    matrices_times_vectors_dim<1>(this,&local_88,&local_98);
    Read<double>::~Read(&local_98);
    Read<double>::~Read(&local_88);
    pvVar1 = extraout_RDX_01;
  }
  RVar2.write_.shared_alloc_.direct_ptr = pvVar1;
  RVar2.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar2.write_.shared_alloc_;
}

Assistant:

Reals matrices_times_vectors(Reals ms, Reals vs, Int dim) {
  if (dim == 3) return matrices_times_vectors_dim<3>(ms, vs);
  if (dim == 2) return matrices_times_vectors_dim<2>(ms, vs);
  if (dim == 1) return matrices_times_vectors_dim<1>(ms, vs);
  OMEGA_H_NORETURN(Reals());
}